

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package_list.h
# Opt level: O0

ssize_t __thiscall PackageList::write(PackageList *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  Value *pVVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  reference value;
  ostream *this_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  undefined1 local_448 [72];
  ofstream fout;
  undefined1 local_208 [8];
  StyledWriter writer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  String *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  String *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_88 [8];
  Value item;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>
  *p;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>_>
  *__range1;
  Value root;
  CCDir *dir_local;
  PackageList *this_local;
  
  root.limit_ = CONCAT44(in_register_00000034,__fd);
  Json::Value::Value((Value *)&__range1,nullValue);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>_>
           ::begin(&this->packages);
  p = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>_>
         ::end(&this->packages);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&p);
    if (!bVar1) break;
    item.limit_ = (ptrdiff_t)
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>
                  ::operator*(&__end1);
    Json::Value::Value((Value *)local_88,nullValue);
    Json::Value::Value((Value *)&__range2,(String *)(item.limit_ + 0x40));
    pVVar2 = Json::Value::operator[]((Value *)local_88,"version");
    Json::Value::operator=(pVVar2,(Value *)&__range2);
    Json::Value::~Value((Value *)&__range2);
    pvVar3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(item.limit_ + 0x60);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar3);
    e = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(pvVar3);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&e);
      if (!bVar1) break;
      local_e0 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      pVVar2 = Json::Value::operator[]((Value *)local_88,"include");
      Json::Value::Value((Value *)&__range2_1,local_e0);
      Json::Value::append(pVVar2,(Value *)&__range2_1);
      Json::Value::~Value((Value *)&__range2_1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    pvVar3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(item.limit_ + 0x78);
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar3);
    e_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(pvVar3);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&e_1);
      if (!bVar1) break;
      local_128 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
      pVVar2 = Json::Value::operator[]((Value *)local_88,"lib");
      Json::Value::Value((Value *)&__range2_2,local_128);
      Json::Value::append(pVVar2,(Value *)&__range2_2);
      Json::Value::~Value((Value *)&__range2_2);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    pvVar3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(item.limit_ + 0x90);
    __end2_2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar3);
    e_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(pvVar3);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2_2,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&e_2);
      if (!bVar1) break;
      value = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end2_2);
      pVVar2 = Json::Value::operator[]((Value *)local_88,"dll");
      Json::Value::Value((Value *)&writer.addChildValues_,value);
      Json::Value::append(pVVar2,(Value *)&writer.addChildValues_);
      Json::Value::~Value((Value *)&writer.addChildValues_);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_2);
    }
    pVVar2 = Json::Value::operator[]((Value *)&__range1,(String *)(item.limit_ + 0x20));
    Json::Value::operator=(pVVar2,(Value *)local_88);
    Json::Value::~Value((Value *)local_88);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Package>_>
    ::operator++(&__end1);
  }
  Json::StyledWriter::StyledWriter((StyledWriter *)local_208);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_448 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (CONCAT44(in_register_00000034,__fd) + 0xa0),"cip_list.json");
  std::ofstream::ofstream(local_448 + 0x40,(string *)(local_448 + 0x20),_S_out);
  std::__cxx11::string::~string((string *)(local_448 + 0x20));
  Json::StyledWriter::write_abi_cxx11_((StyledWriter *)local_448,(int)local_208,&__range1,__n);
  this_00 = std::operator<<((ostream *)(local_448 + 0x40),(string *)local_448);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_448);
  std::ofstream::close();
  std::ofstream::~ofstream(local_448 + 0x40);
  Json::StyledWriter::~StyledWriter((StyledWriter *)local_208);
  Json::Value::~Value((Value *)&__range1);
  return extraout_RAX;
}

Assistant:

void write(CCDir dir){
        Json::Value root;
        for(auto&p:packages){
            Json::Value item;
            item["version"]=p.second.version;
            for(auto&e:p.second.include_files){
                item["include"].append(e);
            }
            for(auto&e:p.second.lib_files){
                item["lib"].append(e);
            }
            for(auto&e:p.second.dll_files){
                item["dll"].append(e);
            }
            root[p.second.name]=item;
        }
        Json::StyledWriter writer;
        std::ofstream fout(dir.compiler_path+"cip_list.json",std::ios::out);
        fout << writer.write(root) << std::endl;
        fout.close();
	}